

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_path.c
# Opt level: O3

char * zt_find_basedir(char *path,char *trigger)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  char *__s;
  stat sbuf;
  char lpath [4097];
  stat local_20d8;
  char local_2048 [4112];
  char local_1038 [4104];
  
  sVar2 = strlen(path);
  memset(local_2048,0,0x1001);
  if (0x1000 < sVar2) {
    sVar2 = 0x1001;
  }
  memcpy(local_2048,path,sVar2);
  memset(local_1038,0,0x1001);
  snprintf(local_1038,0x1001,"%s%s%s",local_2048,"/",trigger);
  piVar3 = __errno_location();
  *piVar3 = 0;
  iVar1 = stat(local_1038,&local_20d8);
  if (iVar1 != 0) {
    do {
      if (local_2048[0] == '\0') {
        return (char *)0x0;
      }
      sVar4 = zt_cstr_rfind(local_2048,0,-1,"/");
      if (sVar4 == -1) {
        return (char *)0x0;
      }
      local_2048[sVar4] = '\0';
      memset(local_1038,0,0x1001);
      snprintf(local_1038,0x1001,"%s%s%s",local_2048,"/",trigger);
      *piVar3 = 0;
      iVar1 = stat(local_1038,&local_20d8);
    } while (iVar1 != 0);
  }
  sVar2 = strlen(local_2048);
  __s = (char *)zt_calloc_p(sVar2 + 2,1);
  snprintf(__s,sVar2 + 2,"%s%s",local_2048,"/");
  return __s;
}

Assistant:

char *zt_find_basedir(const char * path, const char * trigger) {
    struct stat sbuf;
    size_t      len;
    ssize_t     offt;
    char      * result = NULL;
    char        cpath[PATH_MAX + 1];
    char        lpath[PATH_MAX + 1];

    len = strlen(path);
    memset(lpath, 0, sizeof(lpath));
    memcpy(lpath, path, MIN(len, sizeof(cpath)));

    do {
        memset(cpath, 0, sizeof(cpath));
        snprintf(cpath, sizeof(cpath), "%s%s%s", lpath, PATH_SEPERATOR, trigger);
        errno = 0;
        if (stat(cpath, &sbuf) == 0) {
            /* found it */
            len    = strlen(lpath) + strlen(PATH_SEPERATOR) + 1;
            result = zt_callocs(sizeof(char), len);
            snprintf(result, len, "%s%s", lpath, PATH_SEPERATOR);
            break;
        }

        if ((strlen(lpath) == 0) ||
            (offt = zt_cstr_rfind(lpath, 0, -1, PATH_SEPERATOR)) == -1) {
            break;
        }
        lpath[offt] = '\0';
    } while (1);

    return result;
}